

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ge.cpp
# Opt level: O3

void ge_p2_dbl(ge_p1p1 *r,ge_p2 *p)

{
  i32 *h;
  i32 *h_00;
  i32 *h_01;
  fe t0;
  i32 aiStack_58 [10];
  
  fe_sq(r->X,p->X);
  h = r->Z;
  fe_sq(h,p->Y);
  h_00 = r->T;
  fe_sq2(h_00,p->Z);
  h_01 = r->Y;
  fe_add(h_01,p->X,p->Y);
  fe_sq(aiStack_58,h_01);
  fe_add(h_01,h,r->X);
  fe_sub(h,h,r->X);
  fe_sub(r->X,aiStack_58,h_01);
  fe_sub(h_00,h_00,h);
  return;
}

Assistant:

void ge_p2_dbl(ge_p1p1 *r, const ge_p2 *p) {
    fe t0;

    fe_sq(r->X, p->X);
    fe_sq(r->Z, p->Y);
    fe_sq2(r->T, p->Z);
    fe_add(r->Y, p->X, p->Y);
    fe_sq(t0, r->Y);
    fe_add(r->Y, r->Z, r->X);
    fe_sub(r->Z, r->Z, r->X);
    fe_sub(r->X, t0, r->Y);
    fe_sub(r->T, r->T, r->Z);
}